

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O0

MPP_RET avs2_split_nalu(Avs2dCtx_t *p_dec,RK_U8 *buf_start,RK_U32 buf_length,RK_U32 over_read,
                       RK_U32 *remain)

{
  int iVar1;
  RK_U32 header;
  uint uVar2;
  RK_U8 *buf_end;
  RK_U32 nalu_len;
  RK_U32 start_code;
  RK_U8 *start_code_ptr;
  RK_U32 *pRStack_28;
  MPP_RET ret;
  RK_U32 *remain_local;
  RK_U32 over_read_local;
  RK_U32 buf_length_local;
  RK_U8 *buf_start_local;
  Avs2dCtx_t *p_dec_local;
  
  start_code_ptr._4_4_ = MPP_OK;
  _nalu_len = (RK_U8 *)0x0;
  pRStack_28 = remain;
  remain_local._0_4_ = over_read;
  remain_local._4_4_ = buf_length;
  _over_read_local = buf_start;
  buf_start_local = (RK_U8 *)p_dec;
  header = avs2_find_start_code(buf_start,buf_start + ((ulong)buf_length - 1),(RK_U8 **)&nalu_len);
  if (_nalu_len == (RK_U8 *)0x0) {
    if (*(int *)(buf_start_local + 0x137c) == 0) {
      if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_parse","Skip data code before first video_sequence_start_code",
                   "avs2_split_nalu");
      }
    }
    else if (((*(uint *)(buf_start_local + 0x1378) & 0xffffff00) == 0x100) &&
            ((RK_U32)remain_local < remain_local._4_4_)) {
      store_nalu((Avs2dCtx_t *)buf_start_local,_over_read_local + (RK_U32)remain_local,
                 remain_local._4_4_ - (RK_U32)remain_local,*(RK_U32 *)(buf_start_local + 0x1378));
    }
    *pRStack_28 = 0;
  }
  else {
    if ((avs2d_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avs2d_parse","Found start_code 0x%08x at offset 0x%08x, prev_starcode 0x%08x\n",
                 "avs2_split_nalu",(ulong)header,(long)_nalu_len - (long)_over_read_local,
                 *(undefined4 *)(buf_start_local + 0x1378));
    }
    iVar1 = (int)(buf_start + ((ulong)buf_length - 1));
    if (*(int *)(buf_start_local + 0x137c) == 0) {
      if (header == 0x1b0) {
        if ((avs2d_parse_debug & 8) != 0) {
          _mpp_log_l(4,"avs2d_parse","Found the first video_sequence_start_code","avs2_split_nalu");
        }
        buf_start_local[0x78] = '\0';
        buf_start_local[0x79] = '\0';
        buf_start_local[0x7a] = '\0';
        buf_start_local[0x7b] = '\0';
        avs2_add_nalu_header((Avs2dCtx_t *)buf_start_local,0x1b0);
        buf_start_local[0x137c] = '\x01';
        buf_start_local[0x137d] = '\0';
        buf_start_local[0x137e] = '\0';
        buf_start_local[0x137f] = '\0';
        buf_start_local[0x1378] = 0xb0;
        buf_start_local[0x1379] = '\x01';
        buf_start_local[0x137a] = '\0';
        buf_start_local[0x137b] = '\0';
      }
      else if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_parse","Skip start code before first video_sequence_start_code",
                   "avs2_split_nalu");
      }
      *pRStack_28 = iVar1 - (int)_nalu_len;
    }
    else {
      if ((header == 0x1b0) && ((avs2d_parse_debug & 8) != 0)) {
        _mpp_log_l(4,"avs2d_parse","Found repeated video_sequence_start_code","avs2_split_nalu");
      }
      if ((((*(uint *)(buf_start_local + 0x1378) & 0xffffff00) == 0x100) &&
          (*(int *)(buf_start_local + 0x1378) != 0x1b2)) &&
         (uVar2 = ((int)_nalu_len - (int)_over_read_local) - 3, (RK_U32)remain_local < uVar2)) {
        store_nalu((Avs2dCtx_t *)buf_start_local,_over_read_local + (RK_U32)remain_local,
                   uVar2 - (RK_U32)remain_local,*(RK_U32 *)(buf_start_local + 0x1378));
      }
      if (((*(uint *)(buf_start_local + 0x1378) < 0x100) ||
          (399 < *(uint *)(buf_start_local + 0x1378))) || ((0xff < header && (header < 400)))) {
        if (header != 0x1b2) {
          avs2_add_nalu_header((Avs2dCtx_t *)buf_start_local,header);
        }
        if ((header < 0x100) || (399 < header)) {
          if (header == 0x1b1) {
            *(undefined1 *)
             (*(long *)(buf_start_local + 0x70) +
              (ulong)(*(int *)(buf_start_local + 0x78) - 1) * 0x10 + 0xc) = 1;
          }
        }
        else {
          store_nalu((Avs2dCtx_t *)buf_start_local,_nalu_len + -3,4,header);
        }
        *pRStack_28 = iVar1 - (int)_nalu_len;
      }
      else {
        buf_start_local[0x138c] = '\x01';
        buf_start_local[0x138d] = '\0';
        buf_start_local[0x138e] = '\0';
        buf_start_local[0x138f] = '\0';
        *(undefined1 *)
         (*(long *)(buf_start_local + 0x70) + (ulong)(*(int *)(buf_start_local + 0x78) - 1) * 0x10 +
         0xc) = 1;
        *pRStack_28 = (iVar1 - (int)_nalu_len) + 4;
      }
      *(RK_U32 *)(buf_start_local + 0x1378) = header;
    }
  }
  return start_code_ptr._4_4_;
}

Assistant:

MPP_RET avs2_split_nalu(Avs2dCtx_t *p_dec, RK_U8 *buf_start, RK_U32 buf_length, RK_U32 over_read, RK_U32 *remain)
{
    MPP_RET ret = MPP_OK;

    RK_U8 *start_code_ptr = NULL;
    RK_U32 start_code = 0;
    RK_U32 nalu_len = 0;

    RK_U8 *buf_end;

    buf_end = buf_start + buf_length - 1;

    start_code = avs2_find_start_code(buf_start, buf_end, &start_code_ptr);

    if (start_code_ptr) {
        AVS2D_PARSE_TRACE("Found start_code 0x%08x at offset 0x%08x, prev_starcode 0x%08x\n",
                          start_code, start_code_ptr - buf_start, p_dec->prev_start_code);
        if (!p_dec->new_seq_flag) {
            if (start_code == AVS2_VIDEO_SEQUENCE_START_CODE) {
                AVS2D_PARSE_TRACE("Found the first video_sequence_start_code");
                p_dec->nal_cnt = 0;
                avs2_add_nalu_header(p_dec, AVS2_VIDEO_SEQUENCE_START_CODE);
                p_dec->new_seq_flag = 1;
                p_dec->prev_start_code = AVS2_VIDEO_SEQUENCE_START_CODE;
            } else {
                AVS2D_PARSE_TRACE("Skip start code before first video_sequence_start_code");
            }

            *remain = buf_end - start_code_ptr;
        } else {
            if (start_code == AVS2_VIDEO_SEQUENCE_START_CODE) {
                AVS2D_PARSE_TRACE("Found repeated video_sequence_start_code");
            }

            if (AVS2_IS_START_CODE(p_dec->prev_start_code) && p_dec->prev_start_code != AVS2_USER_DATA_START_CODE) {
                nalu_len = start_code_ptr - buf_start - 3;
                if (nalu_len > over_read) {
                    store_nalu(p_dec, buf_start + over_read, nalu_len - over_read, p_dec->prev_start_code);
                }
            }

            if (AVS2_IS_SLICE_START_CODE(p_dec->prev_start_code) && !AVS2_IS_SLICE_START_CODE(start_code)) {
                p_dec->new_frame_flag = 1;
                p_dec->p_nals[p_dec->nal_cnt - 1].eof = 1;
                *remain = buf_end - start_code_ptr + 4;
            } else {
                if (start_code != AVS2_USER_DATA_START_CODE)
                    avs2_add_nalu_header(p_dec, start_code);

                // need to put slice start code to stream buffer
                if (AVS2_IS_SLICE_START_CODE(start_code)) {
                    store_nalu(p_dec, start_code_ptr - 3, 4, start_code);
                } else if (start_code == AVS2_VIDEO_SEQUENCE_END_CODE) {
                    p_dec->p_nals[p_dec->nal_cnt - 1].eof = 1;
                }

                *remain = buf_end - start_code_ptr;
            }

            p_dec->prev_start_code = start_code;
        }
    } else {
        if (!p_dec->new_seq_flag) {
            AVS2D_PARSE_TRACE("Skip data code before first video_sequence_start_code");
        } else {
            if (AVS2_IS_START_CODE(p_dec->prev_start_code)) {
                nalu_len = buf_length;
                if (nalu_len > over_read) {
                    store_nalu(p_dec, buf_start + over_read, nalu_len - over_read, p_dec->prev_start_code);
                }
            }
        }

        *remain = 0;
    }

    return ret;
}